

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarrayblkof.c
# Opt level: O2

void tommy_arrayblkof_grow(tommy_arrayblkof *array,tommy_count_t count)

{
  long lVar1;
  void *pvVar2;
  void **ppvVar3;
  uint count_00;
  uint pos;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (array->count < count) {
    array->count = count;
    count_00 = count + 0xfff >> 0xc;
    pos = (array->block).count;
    if (pos < count_00) {
      tommy_array_grow(&array->block,count_00);
      for (; count_00 != pos; pos = pos + 1) {
        pvVar2 = lrtr_calloc(0x1000,array->element_size);
        ppvVar3 = tommy_array_ref(&array->block,pos);
        *ppvVar3 = pvVar2;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_arrayblkof_grow(tommy_arrayblkof* array, tommy_count_t count)
{
	tommy_count_t block_max;
	tommy_count_t block_mac;

	if (array->count >= count)
		return;
	array->count = count;

	block_max = (count + TOMMY_ARRAYBLKOF_SIZE - 1) / TOMMY_ARRAYBLKOF_SIZE;
	block_mac = tommy_array_size(&array->block);

	if (block_mac < block_max) {
		/* grow the block array */
		tommy_array_grow(&array->block, block_max);

		/* allocate new blocks */
		while (block_mac < block_max) {
			void** ptr = tommy_cast(void**, tommy_calloc(TOMMY_ARRAYBLKOF_SIZE, array->element_size));

			/* set the new block */
			tommy_array_set(&array->block, block_mac, ptr);

			++block_mac;
		}
	}
}